

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_method.h
# Opt level: O2

duk_ret_t dukglue::detail::MethodInfo<false,_B,_const_char_*>::MethodRuntime::call_native_method
                    (duk_context *ctx)

{
  duk_int_t line;
  tuple<> *args;
  MethodType *pMVar1;
  duk_errcode_t err_code;
  char *fmt;
  type bakedArgs;
  
  duk_push_this(ctx);
  duk_get_prop_string(ctx,-1,anon_var_dwarf_c2e7);
  args = (tuple<> *)duk_get_pointer(ctx,-1);
  if (args == (tuple<> *)0x0) {
    fmt = "Invalid native object for \'this\'";
    err_code = -4;
    line = 0x5b;
  }
  else {
    duk_pop_2(ctx);
    duk_push_current_function(ctx);
    duk_get_prop_string(ctx,-1,anon_var_dwarf_df54);
    pMVar1 = (MethodType *)duk_require_pointer(ctx,-1);
    if (pMVar1 != (MethodType *)0x0) {
      duk_pop_2(ctx);
      MethodInfo<false,B,char_const*>::MethodRuntime::actually_call<char_const*>
                (ctx,*pMVar1,(B *)pMVar1[1],args);
      return 1;
    }
    fmt = "Method pointer missing?!";
    err_code = -6;
    line = 0x66;
  }
  duk_error_raw(ctx,err_code,
                "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_method.h"
                ,line,fmt);
}

Assistant:

static duk_ret_t call_native_method(duk_context* ctx)
				{
					// get this.obj_ptr
					duk_push_this(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "obj_ptr");
					void* obj_void = duk_get_pointer(ctx, -1);
					if (obj_void == nullptr) {
						duk_error(ctx, DUK_RET_REFERENCE_ERROR, "Invalid native object for 'this'");
						return DUK_RET_REFERENCE_ERROR;
					}

					duk_pop_2(ctx); // pop this.obj_ptr and this

					// get current_function.method_info
					duk_push_current_function(ctx);
					duk_get_prop_string(ctx, -1, "\xFF" "method_holder");
					void* method_holder_void = duk_require_pointer(ctx, -1);
					if (method_holder_void == nullptr) {
						duk_error(ctx, DUK_RET_TYPE_ERROR, "Method pointer missing?!");
						return DUK_RET_TYPE_ERROR;
					}

					duk_pop_2(ctx);

					// (should always be valid unless someone is intentionally messing with this.obj_ptr...)
					Cls* obj = static_cast<Cls*>(obj_void);
					MethodHolder* method_holder = static_cast<MethodHolder*>(method_holder_void);

					// read arguments and call method
                    auto bakedArgs = dukglue::detail::get_stack_values<Ts...>(ctx);
					actually_call(ctx, method_holder->method, obj, bakedArgs);
					return std::is_void<RetType>::value ? 0 : 1;
				}